

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O1

void __thiscall VECTOR_HORI_VERT::Vector::Vector(Vector *this,Vector *other)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  ulong uVar5;
  
  this->_vptr_Vector = (_func_int **)&PTR___cxa_pure_virtual_00108ce8;
  (this->filename_)._M_dataplus._M_p = (pointer)&(this->filename_).field_2;
  (this->filename_)._M_string_length = 0;
  (this->filename_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->filename_);
  iVar1 = other->L;
  this->L = iVar1;
  uVar5 = 0xffffffffffffffff;
  if (-1 < (long)iVar1) {
    uVar5 = (long)iVar1 * 4;
  }
  piVar4 = (int *)operator_new__(uVar5);
  this->vector_ = piVar4;
  uVar2 = this->L;
  if ((ulong)uVar2 != 0) {
    piVar3 = other->vector_;
    uVar5 = 0;
    do {
      piVar4[uVar5] = piVar3[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  this->znak = other->znak;
  return;
}

Assistant:

Vector::Vector(const Vector& other) {
    filename_ = other.filename_;
    L = other.L;
    vector_ = new int[L];
    for (unsigned int i = 0; i < L; i++) {
      vector_[i] = other.vector_[i];
    }
    this->znak = other.znak;
  }